

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dpcbuilder.cpp
# Opt level: O2

void __thiscall DPCResult::build(DPCResult *this,string *source,string *pathOut)

{
  bool bVar1;
  FILE *__stream;
  DIR *__dirp;
  dirent *pdVar2;
  long lVar3;
  long lVar4;
  runtime_error *prVar5;
  DPCResult *pDVar6;
  FILE *this_00;
  string childPath;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  
  std::__cxx11::string::string((string *)&local_90,(string *)source);
  bVar1 = isADirectory(&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  if (!bVar1) {
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string
              ((string *)&local_b0,"%s is not a directory!\n",(allocator *)&local_f0);
    formatString<char_const*>(&childPath,&local_b0,(source->_M_dataplus)._M_p);
    std::runtime_error::runtime_error(prVar5,(string *)&childPath);
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pDVar6 = (DPCResult *)(pathOut->_M_dataplus)._M_p;
  __stream = fopen((char *)pDVar6,"wb");
  if (__stream != (FILE *)0x0) {
    writeDPCMagic(pDVar6,(FILE *)__stream);
    writeHeader(this,(FILE *)__stream);
    __dirp = opendir((source->_M_dataplus)._M_p);
    while( true ) {
      pdVar2 = readdir(__dirp);
      if (pdVar2 == (dirent *)0x0) break;
      std::__cxx11::string::string((string *)&childPath,pdVar2->d_name,(allocator *)&local_f0);
      bVar1 = std::operator==(&childPath,".");
      if (!bVar1) {
        bVar1 = std::operator==(&childPath,"..");
        if (!bVar1) {
          lVar3 = ftell(__stream);
          std::__cxx11::string::string((string *)&local_70,(string *)source);
          trailFolder(&local_f0,&local_70);
          pDVar6 = (DPCResult *)&stack0xffffffffffffffb0;
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &stack0xffffffffffffffb0,&local_f0,&childPath);
          writeFolder(pDVar6,(FILE *)__stream,(string *)&stack0xffffffffffffffb0);
          std::__cxx11::string::~string((string *)&stack0xffffffffffffffb0);
          std::__cxx11::string::~string((string *)&local_f0);
          std::__cxx11::string::~string((string *)&local_70);
          this_00 = __stream;
          lVar4 = ftell(__stream);
          writePadding((DPCResult *)this_00,(FILE *)__stream,
                       ((int)lVar3 - (int)lVar4) + this->m_blockSize);
        }
      }
      std::__cxx11::string::~string((string *)&childPath);
    }
    closedir(__dirp);
    fclose(__stream);
    return;
  }
  prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string
            ((string *)&local_d0,"Couldn\'t open %s for writing!\n",(allocator *)&local_f0);
  formatString<char_const*>(&childPath,&local_d0,(pathOut->_M_dataplus)._M_p);
  std::runtime_error::runtime_error(prVar5,(string *)&childPath);
  __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void DPCResult::build(std::string source, std::string pathOut){
    if(!isADirectory(source))
        throw NOT_A_DIR(source.c_str());
    FILE *file = fopen(pathOut.c_str(),"wb");
    if(file == nullptr)
        throw CANT_WRITE(pathOut.c_str());
    writeDPCMagic(file);
    writeHeader(file);

    DIR *dir = nullptr;
    struct dirent *entry = nullptr;
    dir = opendir(source.c_str());
    while( (entry=readdir(dir))){
        std::string childPath = entry->d_name;
        if (childPath=="." || childPath == "..")
            continue;
        uint32_t pre = ftell(file);
        writeFolder(file,trailFolder(source)+childPath);
        uint32_t post = ftell(file);
        writePadding(file, m_blockSize-(post-pre));
    }
    closedir(dir);
    fclose(file);
}